

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _dequeIterator.hpp
# Opt level: O0

dequeIterator<double,_32UL> * __thiscall
ft::dequeIterator<double,_32UL>::operator--(dequeIterator<double,_32UL> *this)

{
  dequeIterator<double,_32UL> *this_local;
  
  if (this->m_cur == this->m_first) {
    setNode(this,this->m_node + -1);
    this->m_cur = this->m_last;
  }
  this->m_cur = this->m_cur + -1;
  return this;
}

Assistant:

dequeIterator&	operator--() {
		if (this->m_cur == this->m_first) {
			this->setNode(this->m_node - 1);
			this->m_cur = this->m_last;
		}
		--this->m_cur;
		return *this;
	}